

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_int8_avx2
               (Mat *kernel,Mat *AT,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  size_t sVar7;
  int *piVar8;
  long lVar9;
  int _c;
  uint max_kk;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  short *psVar14;
  int kk;
  ulong uVar15;
  char *pcVar16;
  int m_1;
  long lVar17;
  uint max_ii;
  int TILE_M;
  int TILE_K;
  Mat m;
  int TILE_N;
  uint local_18c;
  ulong local_188;
  int local_17c;
  int local_178;
  int local_174;
  ulong local_170;
  Mat local_168;
  short asStack_11c [2];
  Mat local_118;
  Mat local_c8;
  ulong local_78;
  Mat *local_70;
  short *local_68;
  long local_60;
  Mat *local_58;
  long local_50;
  long local_48;
  void *local_40;
  int local_34;
  
  local_70 = kernel;
  get_optimal_tile_mnk_int8(outch,0,inch,(int *)&local_18c,&local_34,&local_174,opt->num_threads);
  iVar13 = local_174;
  _c = (int)(outch + local_18c + -1) / (int)local_18c;
  iVar11 = local_18c * local_174;
  local_168.cstep = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize._0_4_ = 0;
  local_168.elemsize._4_4_ = 0;
  local_168.elempack = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
  local_78 = (ulong)(uint)outch;
  Mat::create(&local_168,iVar11 * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
  local_188 = (ulong)(uint)inch;
  local_58 = AT;
  Mat::create(AT,iVar11,0x24,(inch + iVar13 + -1) / iVar13,_c,4,(Allocator *)0x0);
  if (0 < _c) {
    local_178 = (int)local_188 * 9;
    local_60 = (long)(int)local_188;
    iVar13 = 0;
    do {
      local_170 = (ulong)(local_18c * iVar13);
      iVar11 = get_omp_thread_num();
      uVar12 = CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
      local_c8.data = (void *)((long)iVar11 * local_168.cstep * uVar12 + (long)local_168.data);
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize._0_4_ = (undefined4)local_168.elemsize;
      local_c8.elemsize._4_4_ = local_168.elemsize._4_4_;
      local_c8.elempack = local_168.elempack;
      local_c8.allocator = local_168.allocator;
      local_c8.d = 1;
      local_c8.h = local_168.h;
      local_c8.c = local_168.d;
      local_c8.cstep =
           (uVar12 * (long)local_168.h * (long)local_168.w + 0xf & 0xfffffffffffffff0) / uVar12;
      local_c8.w = local_168.w;
      local_c8.dims = local_168.dims + -1;
      if (local_168.dims == 4) {
        local_c8.cstep = (long)local_168.h * (long)local_168.w;
      }
      local_17c = iVar13;
      if (0 < (int)local_188) {
        max_ii = (int)local_78 - (int)local_170;
        if ((int)local_18c < (int)max_ii) {
          max_ii = local_18c;
        }
        local_50 = (long)(int)((long)((ulong)(uint)((int)local_170 >> 0x1f) << 0x20 |
                                     local_170 & 0xffffffff) / (long)(int)local_18c);
        local_68 = (short *)local_c8.data;
        uVar12 = 0;
        local_48 = (long)local_174;
        lVar17 = (long)local_174;
        do {
          lVar9 = local_48;
          max_kk = (int)local_188 - (int)uVar12;
          if ((int)(uint)lVar17 < (int)max_kk) {
            max_kk = (uint)lVar17;
          }
          if (0 < (int)max_ii) {
            local_40 = local_70->data;
            uVar10 = 0;
            psVar14 = local_68;
            do {
              if (0 < (int)max_kk) {
                uVar15 = 0;
                do {
                  pcVar16 = (char *)((long)local_40 +
                                    (uVar15 + uVar12) * 9 +
                                    (long)(((int)local_170 + (int)uVar10) * local_178));
                  lVar17 = 0;
                  do {
                    cVar1 = *pcVar16;
                    cVar2 = pcVar16[1];
                    cVar3 = pcVar16[2];
                    *(short *)((long)&local_118.data + lVar17 * 2) = cVar1 * 6;
                    *(short *)((long)&local_118.data + lVar17 * 2 + 6) =
                         -(cVar3 * 4 + cVar2 * 4 + cVar1 * 4);
                    *(short *)((long)&local_118.refcount + lVar17 * 2 + 4) =
                         cVar2 * 4 + cVar1 * -4 + cVar3 * -4;
                    *(short *)((long)&local_118.elemsize + lVar17 * 2 + 2) =
                         (short)cVar1 + cVar2 * 2 + cVar3 * 4;
                    *(short *)((long)&local_118.elempack + lVar17 * 2) =
                         ((short)cVar1 - ((short)cVar2 + (short)cVar2)) + cVar3 * 4;
                    *(short *)(&local_118.field_0x1e + lVar17 * 2) = cVar3 * 6;
                    pcVar16 = pcVar16 + 3;
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 3);
                  lVar17 = 4;
                  do {
                    sVar4 = *(short *)((long)asStack_11c + lVar17);
                    sVar5 = *(short *)((long)asStack_11c + lVar17 + 2);
                    sVar6 = *(short *)((long)&local_118.data + lVar17);
                    *psVar14 = sVar4 * 6;
                    psVar14[1] = -(sVar6 * 4 + sVar5 * 4 + sVar4 * 4);
                    psVar14[2] = sVar5 * 4 + sVar4 * -4 + sVar6 * -4;
                    psVar14[3] = sVar4 + sVar5 * 2 + sVar6 * 4;
                    psVar14[4] = sVar4 + sVar5 * -2 + sVar6 * 4;
                    psVar14[5] = sVar6 * 6;
                    psVar14 = psVar14 + 6;
                    lVar17 = lVar17 + 6;
                  } while (lVar17 != 0x28);
                  uVar15 = uVar15 + 1;
                } while (uVar15 != max_kk);
              }
              uVar10 = uVar10 + 1;
            } while (uVar10 != max_ii);
          }
          sVar7 = local_58->elemsize;
          local_118.h = local_58->h;
          local_118.elempack = local_58->elempack;
          local_118.allocator = local_58->allocator;
          local_118.cstep = (long)local_118.h * (long)local_58->w;
          local_118.data =
               (void *)((long)local_58->data +
                       sVar7 * local_118.cstep *
                       (long)(int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 |
                                         uVar12 & 0xffffffff) / (long)(int)local_48) +
                       local_58->cstep * local_50 * sVar7);
          local_118.refcount._0_4_ = 0;
          local_118.refcount._4_4_ = 0;
          local_118.elemsize._0_4_ = (undefined4)sVar7;
          local_118.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
          local_118.w = local_58->w;
          local_118.dims = 2;
          local_118.d = 1;
          local_118.c = 1;
          pack_A_tile_int8(&local_c8,&local_118,0x24,max_ii,max_kk);
          local_118.cstep = 0;
          local_118.data = (void *)0x0;
          local_118.refcount._0_4_ = 0;
          local_118.refcount._4_4_ = 0;
          local_118.elemsize._0_4_ = 0;
          local_118.elemsize._4_4_ = 0;
          local_118.elempack = 0;
          local_118.dims = 0;
          local_118.w = 0;
          local_118.h = 0;
          local_118.d = 0;
          local_118.c = 0;
          uVar12 = uVar12 + lVar9;
          lVar17 = lVar9;
        } while ((long)uVar12 < local_60);
      }
      iVar13 = local_17c;
      piVar8 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if ((short *)local_c8.data != (short *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_c8.cstep = 0;
      local_c8.data = (void *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize._0_4_ = 0;
      local_c8.elemsize._4_4_ = 0;
      local_c8.elempack = 0;
      local_c8.dims = 0;
      local_c8.w = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      iVar13 = iVar13 + 1;
    } while (iVar13 != _c);
  }
  piVar8 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_int8_avx2(const Mat& kernel, Mat& AT, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_int8(kernel, AT, inch, outch, opt);
}